

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_s2c_verify_commit
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *data32,
              secp256k1_ecdsa_s2c_opening *opening)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  long lVar6;
  secp256k1_ge *psVar7;
  void *pvVar8;
  secp256k1_ge *psVar9;
  char *pcVar10;
  size_t in_R8;
  byte bVar11;
  uchar x_bytes [32];
  secp256k1_ge commitment_ge;
  secp256k1_scalar x_scalar;
  secp256k1_ge original_pubnonce_ge;
  secp256k1_sha256 s2c_sha;
  
  bVar11 = 0;
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar10 = "secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)";
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar10 = "sig != NULL";
  }
  else if (data32 == (uchar *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar10 = "data32 != NULL";
  }
  else {
    if (opening != (secp256k1_ecdsa_s2c_opening *)0x0) {
      iVar5 = secp256k1_pubkey_load(ctx,&original_pubnonce_ge,(secp256k1_pubkey *)opening);
      if (iVar5 == 0) {
        return 0;
      }
      secp256k1_s2c_ecdsa_point_sha256_tagged(&s2c_sha);
      psVar7 = &original_pubnonce_ge;
      psVar9 = &commitment_ge;
      for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
        (psVar9->x).n[0] = (psVar7->x).n[0];
        psVar7 = (secp256k1_ge *)((long)psVar7 + (ulong)bVar11 * -0x10 + 8);
        psVar9 = (secp256k1_ge *)((long)psVar9 + (ulong)bVar11 * -0x10 + 8);
      }
      iVar5 = secp256k1_ec_commit_tweak(x_bytes,&commitment_ge,&s2c_sha,data32,in_R8);
      if (iVar5 == 0) {
        return 0;
      }
      iVar5 = secp256k1_ec_pubkey_tweak_add_helper(&ctx->ecmult_ctx,&commitment_ge,x_bytes);
      if (iVar5 == 0) {
        return 0;
      }
      uVar1 = *(uint64_t *)sig->data;
      uVar2 = *(uint64_t *)(sig->data + 8);
      uVar3 = *(uint64_t *)(sig->data + 0x10);
      uVar4 = *(uint64_t *)(sig->data + 0x18);
      secp256k1_fe_normalize(&commitment_ge.x);
      secp256k1_fe_get_b32(x_bytes,&commitment_ge.x);
      secp256k1_scalar_set_b32(&x_scalar,x_bytes,(int *)0x0);
      return (uint)(uVar4 == x_scalar.d[3] &&
                   (uVar3 == x_scalar.d[2] && (uVar2 == x_scalar.d[1] && uVar1 == x_scalar.d[0])));
    }
    pvVar8 = (ctx->illegal_callback).data;
    pcVar10 = "opening != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar10,pvVar8);
  return 0;
}

Assistant:

int secp256k1_ecdsa_s2c_verify_commit(const secp256k1_context* ctx, const secp256k1_ecdsa_signature* sig, const unsigned char* data32, const secp256k1_ecdsa_s2c_opening* opening) {
    secp256k1_ge commitment_ge;
    secp256k1_ge original_pubnonce_ge;
    unsigned char x_bytes[32];
    secp256k1_scalar sigr, sigs, x_scalar;
    secp256k1_sha256 s2c_sha;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(sig != NULL);
    ARG_CHECK(data32 != NULL);
    ARG_CHECK(opening != NULL);

    if (!secp256k1_ecdsa_s2c_opening_load(ctx, &original_pubnonce_ge, opening)) {
        return 0;
    }
    secp256k1_s2c_ecdsa_point_sha256_tagged(&s2c_sha);
    if (!secp256k1_ec_commit(&ctx->ecmult_ctx, &commitment_ge, &original_pubnonce_ge, &s2c_sha, data32, 32)) {
        return 0;
    }

    /* Check that sig_r == commitment_x (mod n)
     * sig_r is the x coordinate of R represented by a scalar.
     * commitment_x is the x coordinate of the commitment (field element).
     *
     * Note that we are only checking the x-coordinate -- this is because the y-coordinate
     * is not part of the ECDSA signature (and therefore not part of the commitment!)
     */
    secp256k1_ecdsa_signature_load(ctx, &sigr, &sigs, sig);

    secp256k1_fe_normalize(&commitment_ge.x);
    secp256k1_fe_get_b32(x_bytes, &commitment_ge.x);
    /* Do not check overflow; overflowing a scalar does not affect whether
     * or not the R value is a cryptographic commitment, only whether it
     * is a valid R value for an ECDSA signature. If users care about that
     * they should use `ecdsa_verify` or `anti_exfil_host_verify`. In other
     * words, this check would be (at best) unnecessary, and (at worst)
     * insufficient. */
    secp256k1_scalar_set_b32(&x_scalar, x_bytes, NULL);
    return secp256k1_scalar_eq(&sigr, &x_scalar);
}